

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueInfo.h
# Opt level: O2

void __thiscall ValueInfo::SetSymStore(ValueInfo *this,Sym *sym)

{
  code *pcVar1;
  bool bVar2;
  StackSym *pSVar3;
  undefined4 *puVar4;
  
  if ((sym != (Sym *)0x0) && (sym->m_kind != SymKindProperty)) {
    pSVar3 = Sym::AsStackSym(sym);
    if ((pSVar3->field_0x1a & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ValueInfo.h"
                         ,0xff,
                         "(sym == nullptr || sym->IsPropertySym() || !sym->AsStackSym()->IsTypeSpec())"
                         ,
                         "sym == nullptr || sym->IsPropertySym() || !sym->AsStackSym()->IsTypeSpec()"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  this->symStore = sym;
  return;
}

Assistant:

void                    SetSymStore(Sym * sym)
    {
        // Sym store should always be a var sym
        Assert(sym == nullptr || sym->IsPropertySym() || !sym->AsStackSym()->IsTypeSpec()); // property syms always have a var stack sym
        this->symStore = sym;
    }